

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::AST::TypeDeclarationBase_*,_8UL>::pop_back
          (ArrayWithPreallocation<soul::AST::TypeDeclarationBase_*,_8UL> *this)

{
  ArrayWithPreallocation<soul::AST::TypeDeclarationBase_*,_8UL> *this_local;
  
  if (this->numActive == 1) {
    clear(this);
  }
  else {
    checkAssertion(this->numActive != 0,"numActive > 0","pop_back",0xdd);
    this->numActive = this->numActive - 1;
  }
  return;
}

Assistant:

void pop_back()
    {
        if (numActive == 1)
        {
            clear();
        }
        else
        {
            SOUL_ASSERT (numActive > 0);
            items[--numActive].~Item();
        }
    }